

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeUnary(TranslateToFuzzReader *this,Type type)

{
  Random *pRVar1;
  uint32_t uVar2;
  UnaryOp UVar3;
  Expression *pEVar4;
  Type TVar5;
  Expression *pEVar6;
  FeatureOptions<wasm::UnaryOp> *pFVar7;
  UnaryOp first;
  UnaryArgs local_68;
  undefined1 local_58 [8];
  Expression *pEStack_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  size_t local_30;
  
  if ((type.id & 1) != 0 && 6 < type.id) {
    __assert_fail("!type.isTuple()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xedb,"Expression *wasm::TranslateToFuzzReader::makeUnary(Type)");
  }
  if ((type.id & 1) == 0 && 6 < type.id) {
LAB_001482a6:
    pEVar4 = makeTrivial(this,type);
    return pEVar4;
  }
  switch(type.id) {
  case 0:
  case 1:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xfca);
  case 2:
    TVar5 = getSingleConcreteType(this);
    if ((TVar5.id & 1) == 0 && 6 < TVar5.id) goto LAB_001482a6;
    switch(TVar5.id) {
    case 0:
    case 1:
      wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xf16);
    case 2:
      local_40 = (_Base_ptr)&pEStack_50;
      local_58 = (undefined1  [8])0x0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)local_58,(FeatureSet)0x0,EqZInt32,
                          ClzInt32,CtzInt32,PopcntInt32);
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         (pFVar7,(FeatureSet)0x20,ExtendS8Int32,ExtendS16Int32);
      UVar3 = Random::pick<wasm::UnaryOp>(&this->random,pFVar7);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)local_58);
      local_58._0_4_ = UVar3;
      TVar5.id = 2;
      break;
    case 3:
      local_58._0_4_ = Random::pick<wasm::UnaryOp,wasm::UnaryOp>(&this->random,EqZInt64,WrapInt64);
      goto LAB_00148a0b;
    case 4:
      local_40 = (_Base_ptr)&pEStack_50;
      local_58 = (undefined1  [8])0x0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)local_58,(FeatureSet)0x0,
                          TruncSFloat32ToInt32,TruncUFloat32ToInt32,ReinterpretFloat32);
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         (pFVar7,(FeatureSet)0x4,TruncSatSFloat32ToInt32,TruncSatUFloat32ToInt32);
      UVar3 = Random::pick<wasm::UnaryOp>(&this->random,pFVar7);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)local_58);
      local_58._0_4_ = UVar3;
      TVar5.id = 4;
      break;
    case 5:
      local_40 = (_Base_ptr)&pEStack_50;
      local_58 = (undefined1  [8])0x0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)local_58,(FeatureSet)0x0,
                          TruncSFloat64ToInt32,TruncUFloat64ToInt32);
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         (pFVar7,(FeatureSet)0x4,TruncSatSFloat64ToInt32,TruncSatUFloat64ToInt32);
      UVar3 = Random::pick<wasm::UnaryOp>(&this->random,pFVar7);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)local_58);
      local_58._0_4_ = UVar3;
      TVar5.id = 5;
      break;
    case 6:
      if (((this->wasm->features).features & 8) == 0) {
        __assert_fail("wasm.features.hasSIMD()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0xf07,"Expression *wasm::TranslateToFuzzReader::makeUnary(Type)");
      }
      local_40 = (_Base_ptr)&pEStack_50;
      local_58 = (undefined1  [8])0x0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::
               add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)local_58,(FeatureSet)0x8,AnyTrueVec128,
                          AllTrueVecI8x16,AllTrueVecI16x8,AllTrueVecI32x4,AllTrueVecI64x2,
                          BitmaskVecI8x16,BitmaskVecI16x8,BitmaskVecI32x4,BitmaskVecI64x2);
      UVar3 = Random::pick<wasm::UnaryOp>(&this->random,pFVar7);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)local_58);
      local_58._0_4_ = UVar3;
      TVar5.id = 6;
      break;
    default:
      goto switchD_001482d6_default;
    }
    pEStack_50 = make(this,TVar5);
    goto LAB_00148aac;
  case 3:
    pRVar1 = &this->random;
    uVar2 = Random::upTo(pRVar1,4);
    switch(uVar2) {
    case 0:
      local_40 = (_Base_ptr)&pEStack_50;
      local_58 = (undefined1  [8])0x0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)local_58,(FeatureSet)0x0,ClzInt64,
                          CtzInt64,PopcntInt64);
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                         (pFVar7,(FeatureSet)0x20,ExtendS8Int64,ExtendS16Int64,ExtendS32Int64);
      UVar3 = Random::pick<wasm::UnaryOp>(pRVar1,pFVar7);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)local_58);
      goto LAB_00148634;
    case 1:
      first = ExtendSInt32;
      UVar3 = ExtendUInt32;
LAB_001486fb:
      UVar3 = Random::pick<wasm::UnaryOp,wasm::UnaryOp>(&this->random,first,UVar3);
LAB_00148719:
      TVar5.id = 2;
      break;
    case 2:
      local_40 = (_Base_ptr)&pEStack_50;
      local_58 = (undefined1  [8])0x0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)local_58,(FeatureSet)0x0,
                          TruncSFloat32ToInt64,TruncUFloat32ToInt64);
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         (pFVar7,(FeatureSet)0x4,TruncSatSFloat32ToInt64,TruncSatUFloat32ToInt64);
      UVar3 = Random::pick<wasm::UnaryOp>(pRVar1,pFVar7);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)local_58);
LAB_00148603:
      TVar5.id = 4;
      break;
    case 3:
      local_40 = (_Base_ptr)&pEStack_50;
      local_58 = (undefined1  [8])0x0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)local_58,(FeatureSet)0x0,
                          TruncSFloat64ToInt64,TruncUFloat64ToInt64,ReinterpretFloat64);
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         (pFVar7,(FeatureSet)0x4,TruncSatSFloat64ToInt64,TruncSatUFloat64ToInt64);
      UVar3 = Random::pick<wasm::UnaryOp>(pRVar1,pFVar7);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)local_58);
LAB_001486a4:
      TVar5.id = 5;
      break;
    default:
      wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xf3e);
    }
    goto LAB_00148721;
  case 4:
    pRVar1 = &this->random;
    uVar2 = Random::upTo(pRVar1,4);
    switch(uVar2) {
    case 0:
      UVar3 = Random::
              pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                        (pRVar1,NegFloat32,AbsFloat32,CeilFloat32,FloorFloat32,TruncFloat32,
                         NearestFloat32,SqrtFloat32);
      goto LAB_00148603;
    case 1:
      UVar3 = Random::pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                        (pRVar1,ConvertUInt32ToFloat32,ConvertSInt32ToFloat32,ReinterpretInt32);
      goto LAB_00148719;
    case 2:
      UVar3 = Random::pick<wasm::UnaryOp,wasm::UnaryOp>
                        (pRVar1,ConvertUInt64ToFloat32,ConvertSInt64ToFloat32);
      break;
    case 3:
      pEVar4 = make(this,(Type)0x5);
      pEVar6 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
      pEVar6->_id = UnaryId;
      (pEVar6->type).id = 0;
      *(undefined4 *)(pEVar6 + 1) = 0x2c;
LAB_001486e8:
      pEVar6[1].type.id = (uintptr_t)pEVar4;
      goto LAB_0014875a;
    default:
      wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xf57);
    }
    break;
  case 5:
    pRVar1 = &this->random;
    uVar2 = Random::upTo(pRVar1,4);
    switch(uVar2) {
    case 0:
      UVar3 = Random::
              pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                        (pRVar1,NegFloat64,AbsFloat64,CeilFloat64,FloorFloat64,TruncFloat64,
                         NearestFloat64,SqrtFloat64);
      goto LAB_001486a4;
    case 1:
      first = ConvertUInt32ToFloat64;
      UVar3 = ConvertSInt32ToFloat64;
      goto LAB_001486fb;
    case 2:
      UVar3 = Random::pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                        (pRVar1,ConvertUInt64ToFloat64,ConvertSInt64ToFloat64,ReinterpretInt64);
      break;
    case 3:
      pEVar4 = make(this,(Type)0x4);
      pEVar6 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
      pEVar6->_id = UnaryId;
      (pEVar6->type).id = 0;
      *(undefined4 *)(pEVar6 + 1) = 0x2b;
      goto LAB_001486e8;
    default:
      wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xf70);
    }
    break;
  case 6:
    if (((this->wasm->features).features & 8) == 0) {
      __assert_fail("wasm.features.hasSIMD()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xf73,"Expression *wasm::TranslateToFuzzReader::makeUnary(Type)");
    }
    pRVar1 = &this->random;
    uVar2 = Random::upTo(pRVar1,5);
    switch(uVar2) {
    case 0:
      local_58._0_4_ =
           Random::pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                     (pRVar1,SplatVecI8x16,SplatVecI16x8,SplatVecI32x4);
      TVar5.id = 2;
      break;
    case 1:
      local_58._0_4_ = 0x3f;
LAB_00148a0b:
      TVar5.id = 3;
      break;
    case 2:
      local_58._0_4_ = 0x40;
      TVar5.id = 4;
      break;
    case 3:
      local_58._0_4_ = 0x41;
      TVar5.id = 5;
      break;
    case 4:
      local_40 = (_Base_ptr)&pEStack_50;
      local_48 = (_Base_ptr)0x0;
      local_58 = (undefined1  [8])0x0;
      pEStack_50 = (Expression *)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::
               add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)local_58,(FeatureSet)0x8,NotVec128,
                          AbsVecI8x16,AbsVecI16x8,AbsVecI32x4,AbsVecI64x2,PopcntVecI8x16,NegVecI8x16
                          ,NegVecI16x8,NegVecI32x4,NegVecI64x2,AbsVecF32x4,NegVecF32x4,SqrtVecF32x4,
                          CeilVecF32x4,FloorVecF32x4,TruncVecF32x4,NearestVecF32x4,AbsVecF64x2,
                          NegVecF64x2,SqrtVecF64x2,CeilVecF64x2,FloorVecF64x2,TruncVecF64x2,
                          NearestVecF64x2,ExtAddPairwiseSVecI8x16ToI16x8,
                          ExtAddPairwiseUVecI8x16ToI16x8,ExtAddPairwiseSVecI16x8ToI32x4,
                          ExtAddPairwiseUVecI16x8ToI32x4,TruncSatSVecF32x4ToVecI32x4,
                          TruncSatUVecF32x4ToVecI32x4,ConvertSVecI32x4ToVecF32x4,
                          ConvertUVecI32x4ToVecF32x4,ExtendLowSVecI8x16ToVecI16x8,
                          ExtendHighSVecI8x16ToVecI16x8,ExtendLowUVecI8x16ToVecI16x8,
                          ExtendHighUVecI8x16ToVecI16x8,ExtendLowSVecI16x8ToVecI32x4,
                          ExtendHighSVecI16x8ToVecI32x4,ExtendLowUVecI16x8ToVecI32x4,
                          ExtendHighUVecI16x8ToVecI32x4,ExtendLowSVecI32x4ToVecI64x2,
                          ExtendHighSVecI32x4ToVecI64x2,ExtendLowUVecI32x4ToVecI64x2,
                          ExtendHighUVecI32x4ToVecI64x2,ConvertLowSVecI32x4ToVecF64x2,
                          ConvertLowUVecI32x4ToVecF64x2,TruncSatZeroSVecF64x2ToVecI32x4,
                          TruncSatZeroUVecF64x2ToVecI32x4,DemoteZeroVecF64x2ToVecF32x4,
                          PromoteLowVecF32x4ToVecF64x2);
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                         (pFVar7,(FeatureSet)0x1000,RelaxedTruncSVecF32x4ToVecI32x4,
                          RelaxedTruncUVecF32x4ToVecI32x4,RelaxedTruncZeroSVecF64x2ToVecI32x4,
                          RelaxedTruncZeroUVecF64x2ToVecI32x4);
      pFVar7 = Random::FeatureOptions<wasm::UnaryOp>::
               add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                         (pFVar7,(FeatureSet)0x40000,AbsVecF16x8,NegVecF16x8,SqrtVecF16x8,
                          CeilVecF16x8,FloorVecF16x8,TruncVecF16x8,NearestVecF16x8,
                          TruncSatSVecF16x8ToVecI16x8,TruncSatUVecF16x8ToVecI16x8,
                          ConvertSVecI16x8ToVecF16x8,ConvertUVecI16x8ToVecF16x8);
      local_68.a = Random::pick<wasm::UnaryOp>(pRVar1,pFVar7);
      local_68.b = make(this,(Type)0x6);
      pEVar4 = buildUnary(this,&local_68);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)local_58);
      return pEVar4;
    default:
      wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xfc6);
    }
    pEStack_50 = make(this,TVar5);
LAB_00148aac:
    pEVar4 = buildUnary(this,(UnaryArgs *)local_58);
    return pEVar4;
  default:
switchD_001482d6_default:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
LAB_00148634:
  TVar5.id = 3;
LAB_00148721:
  pEVar4 = make(this,TVar5);
  pEVar6 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  pEVar6->_id = UnaryId;
  (pEVar6->type).id = 0;
  *(UnaryOp *)(pEVar6 + 1) = UVar3;
  pEVar6[1].type.id = (uintptr_t)pEVar4;
LAB_0014875a:
  wasm::Unary::finalize();
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeUnary(Type type) {
  assert(!type.isTuple());
  // There are no unary ops for reference types.
  // TODO: not quite true if you count struct.new and array.new.
  if (type.isRef()) {
    return makeTrivial(type);
  }
  switch (type.getBasic()) {
    case Type::i32: {
      auto singleConcreteType = getSingleConcreteType();
      if (singleConcreteType.isRef()) {
        // TODO: Do something more interesting here.
        return makeTrivial(type);
      }
      switch (singleConcreteType.getBasic()) {
        case Type::i32: {
          auto op = pick(
            FeatureOptions<UnaryOp>()
              .add(FeatureSet::MVP, EqZInt32, ClzInt32, CtzInt32, PopcntInt32)
              .add(FeatureSet::SignExt, ExtendS8Int32, ExtendS16Int32));
          return buildUnary({op, make(Type::i32)});
        }
        case Type::i64:
          return buildUnary({pick(EqZInt64, WrapInt64), make(Type::i64)});
        case Type::f32: {
          auto op = pick(FeatureOptions<UnaryOp>()
                           .add(FeatureSet::MVP,
                                TruncSFloat32ToInt32,
                                TruncUFloat32ToInt32,
                                ReinterpretFloat32)
                           .add(FeatureSet::TruncSat,
                                TruncSatSFloat32ToInt32,
                                TruncSatUFloat32ToInt32));
          return buildUnary({op, make(Type::f32)});
        }
        case Type::f64: {
          auto op = pick(
            FeatureOptions<UnaryOp>()
              .add(FeatureSet::MVP, TruncSFloat64ToInt32, TruncUFloat64ToInt32)
              .add(FeatureSet::TruncSat,
                   TruncSatSFloat64ToInt32,
                   TruncSatUFloat64ToInt32));
          return buildUnary({op, make(Type::f64)});
        }
        case Type::v128: {
          assert(wasm.features.hasSIMD());
          auto op = pick(FeatureOptions<UnaryOp>().add(FeatureSet::SIMD,
                                                       AnyTrueVec128,
                                                       AllTrueVecI8x16,
                                                       AllTrueVecI16x8,
                                                       AllTrueVecI32x4,
                                                       AllTrueVecI64x2,
                                                       BitmaskVecI8x16,
                                                       BitmaskVecI16x8,
                                                       BitmaskVecI32x4,
                                                       BitmaskVecI64x2));
          return buildUnary({op, make(Type::v128)});
        }
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      WASM_UNREACHABLE("invalid type");
    }
    case Type::i64: {
      switch (upTo(4)) {
        case 0: {
          auto op =
            pick(FeatureOptions<UnaryOp>()
                   .add(FeatureSet::MVP, ClzInt64, CtzInt64, PopcntInt64)
                   .add(FeatureSet::SignExt,
                        ExtendS8Int64,
                        ExtendS16Int64,
                        ExtendS32Int64));
          return buildUnary({op, make(Type::i64)});
        }
        case 1:
          return buildUnary(
            {pick(ExtendSInt32, ExtendUInt32), make(Type::i32)});
        case 2: {
          auto op = pick(
            FeatureOptions<UnaryOp>()
              .add(FeatureSet::MVP, TruncSFloat32ToInt64, TruncUFloat32ToInt64)
              .add(FeatureSet::TruncSat,
                   TruncSatSFloat32ToInt64,
                   TruncSatUFloat32ToInt64));
          return buildUnary({op, make(Type::f32)});
        }
        case 3: {
          auto op = pick(FeatureOptions<UnaryOp>()
                           .add(FeatureSet::MVP,
                                TruncSFloat64ToInt64,
                                TruncUFloat64ToInt64,
                                ReinterpretFloat64)
                           .add(FeatureSet::TruncSat,
                                TruncSatSFloat64ToInt64,
                                TruncSatUFloat64ToInt64));
          return buildUnary({op, make(Type::f64)});
        }
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::f32: {
      switch (upTo(4)) {
        case 0:
          return buildUnary({pick(NegFloat32,
                                  AbsFloat32,
                                  CeilFloat32,
                                  FloorFloat32,
                                  TruncFloat32,
                                  NearestFloat32,
                                  SqrtFloat32),
                             make(Type::f32)});
        case 1:
          return buildUnary({pick(ConvertUInt32ToFloat32,
                                  ConvertSInt32ToFloat32,
                                  ReinterpretInt32),
                             make(Type::i32)});
        case 2:
          return buildUnary(
            {pick(ConvertUInt64ToFloat32, ConvertSInt64ToFloat32),
             make(Type::i64)});
        case 3:
          return buildUnary({DemoteFloat64, make(Type::f64)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::f64: {
      switch (upTo(4)) {
        case 0:
          return buildUnary({pick(NegFloat64,
                                  AbsFloat64,
                                  CeilFloat64,
                                  FloorFloat64,
                                  TruncFloat64,
                                  NearestFloat64,
                                  SqrtFloat64),
                             make(Type::f64)});
        case 1:
          return buildUnary(
            {pick(ConvertUInt32ToFloat64, ConvertSInt32ToFloat64),
             make(Type::i32)});
        case 2:
          return buildUnary({pick(ConvertUInt64ToFloat64,
                                  ConvertSInt64ToFloat64,
                                  ReinterpretInt64),
                             make(Type::i64)});
        case 3:
          return buildUnary({PromoteFloat32, make(Type::f32)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::v128: {
      assert(wasm.features.hasSIMD());
      switch (upTo(5)) {
        case 0:
          return buildUnary({pick(SplatVecI8x16, SplatVecI16x8, SplatVecI32x4),
                             make(Type::i32)});
        case 1:
          return buildUnary({SplatVecI64x2, make(Type::i64)});
        case 2:
          return buildUnary({SplatVecF32x4, make(Type::f32)});
        case 3:
          return buildUnary({SplatVecF64x2, make(Type::f64)});
        case 4:
          return buildUnary({pick(FeatureOptions<UnaryOp>()
                                    .add(FeatureSet::SIMD,
                                         NotVec128,
                                         AbsVecI8x16,
                                         AbsVecI16x8,
                                         AbsVecI32x4,
                                         AbsVecI64x2,
                                         PopcntVecI8x16,
                                         NegVecI8x16,
                                         NegVecI16x8,
                                         NegVecI32x4,
                                         NegVecI64x2,
                                         AbsVecF32x4,
                                         NegVecF32x4,
                                         SqrtVecF32x4,
                                         CeilVecF32x4,
                                         FloorVecF32x4,
                                         TruncVecF32x4,
                                         NearestVecF32x4,
                                         AbsVecF64x2,
                                         NegVecF64x2,
                                         SqrtVecF64x2,
                                         CeilVecF64x2,
                                         FloorVecF64x2,
                                         TruncVecF64x2,
                                         NearestVecF64x2,
                                         ExtAddPairwiseSVecI8x16ToI16x8,
                                         ExtAddPairwiseUVecI8x16ToI16x8,
                                         ExtAddPairwiseSVecI16x8ToI32x4,
                                         ExtAddPairwiseUVecI16x8ToI32x4,
                                         TruncSatSVecF32x4ToVecI32x4,
                                         TruncSatUVecF32x4ToVecI32x4,
                                         ConvertSVecI32x4ToVecF32x4,
                                         ConvertUVecI32x4ToVecF32x4,
                                         ExtendLowSVecI8x16ToVecI16x8,
                                         ExtendHighSVecI8x16ToVecI16x8,
                                         ExtendLowUVecI8x16ToVecI16x8,
                                         ExtendHighUVecI8x16ToVecI16x8,
                                         ExtendLowSVecI16x8ToVecI32x4,
                                         ExtendHighSVecI16x8ToVecI32x4,
                                         ExtendLowUVecI16x8ToVecI32x4,
                                         ExtendHighUVecI16x8ToVecI32x4,
                                         ExtendLowSVecI32x4ToVecI64x2,
                                         ExtendHighSVecI32x4ToVecI64x2,
                                         ExtendLowUVecI32x4ToVecI64x2,
                                         ExtendHighUVecI32x4ToVecI64x2,
                                         ConvertLowSVecI32x4ToVecF64x2,
                                         ConvertLowUVecI32x4ToVecF64x2,
                                         TruncSatZeroSVecF64x2ToVecI32x4,
                                         TruncSatZeroUVecF64x2ToVecI32x4,
                                         DemoteZeroVecF64x2ToVecF32x4,
                                         PromoteLowVecF32x4ToVecF64x2)
                                    .add(FeatureSet::RelaxedSIMD,
                                         RelaxedTruncSVecF32x4ToVecI32x4,
                                         RelaxedTruncUVecF32x4ToVecI32x4,
                                         RelaxedTruncZeroSVecF64x2ToVecI32x4,
                                         RelaxedTruncZeroUVecF64x2ToVecI32x4)
                                    .add(FeatureSet::FP16,
                                         AbsVecF16x8,
                                         NegVecF16x8,
                                         SqrtVecF16x8,
                                         CeilVecF16x8,
                                         FloorVecF16x8,
                                         TruncVecF16x8,
                                         NearestVecF16x8,
                                         TruncSatSVecF16x8ToVecI16x8,
                                         TruncSatUVecF16x8ToVecI16x8,
                                         ConvertSVecI16x8ToVecF16x8,
                                         ConvertUVecI16x8ToVecF16x8)),
                             make(Type::v128)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}